

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

SIMDShift * __thiscall
wasm::Builder::makeSIMDShift(Builder *this,SIMDShiftOp op,Expression *vec,Expression *shift)

{
  SIMDShift *pSVar1;
  SIMDShift *ret;
  Expression *shift_local;
  Expression *vec_local;
  SIMDShiftOp op_local;
  Builder *this_local;
  
  pSVar1 = MixedArena::alloc<wasm::SIMDShift>((MixedArena *)(this->wasm + 0x200));
  pSVar1->op = op;
  pSVar1->vec = vec;
  pSVar1->shift = shift;
  wasm::SIMDShift::finalize();
  return pSVar1;
}

Assistant:

SIMDShift* makeSIMDShift(SIMDShiftOp op, Expression* vec, Expression* shift) {
    auto* ret = wasm.allocator.alloc<SIMDShift>();
    ret->op = op;
    ret->vec = vec;
    ret->shift = shift;
    ret->finalize();
    return ret;
  }